

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O2

void __thiscall
jsoncons::
key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::key_value<double>(key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *this,key_type *name,double *args)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::basic_json<double,void>
            ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&this->value_,args);
  return;
}

Assistant:

key_value(key_type&& name,  Args&& ... args) 
            : key_(std::move(name)), value_(std::forward<Args>(args)...)
        {
        }